

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mips.cpp
# Opt level: O0

unique_ptr<IElfRelocator,_std::default_delete<IElfRelocator>_> __thiscall
CMipsArchitecture::getElfRelocator(CMipsArchitecture *this)

{
  long in_RSI;
  unique_ptr<MipsElfRelocator,_std::default_delete<MipsElfRelocator>_> local_20 [2];
  CMipsArchitecture *this_local;
  
  this_local = this;
  if (*(uint *)(in_RSI + 0x14) < 4) {
    std::make_unique<MipsElfRelocator>();
    std::unique_ptr<IElfRelocator,std::default_delete<IElfRelocator>>::
    unique_ptr<MipsElfRelocator,std::default_delete<MipsElfRelocator>,void>
              ((unique_ptr<IElfRelocator,std::default_delete<IElfRelocator>> *)this,local_20);
    std::unique_ptr<MipsElfRelocator,_std::default_delete<MipsElfRelocator>_>::~unique_ptr(local_20)
    ;
  }
  else {
    std::unique_ptr<IElfRelocator,std::default_delete<IElfRelocator>>::
    unique_ptr<std::default_delete<IElfRelocator>,void>
              ((unique_ptr<IElfRelocator,std::default_delete<IElfRelocator>> *)this,(nullptr_t)0x0);
  }
  return (__uniq_ptr_data<IElfRelocator,_std::default_delete<IElfRelocator>,_true,_true>)
         (__uniq_ptr_data<IElfRelocator,_std::default_delete<IElfRelocator>,_true,_true>)this;
}

Assistant:

std::unique_ptr<IElfRelocator> CMipsArchitecture::getElfRelocator()
{
	switch (Version)
	{
	case MARCH_PS2:
	case MARCH_PSP:
	case MARCH_N64:
	case MARCH_PSX:
		return std::make_unique<MipsElfRelocator>();
	case MARCH_RSP:
	default:
		return nullptr;
	}
}